

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

HFParsingInfo * __thiscall
MlmWrap::createDigitalParsingInfo
          (HFParsingInfo *__return_storage_ptr__,MlmWrap *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels,string *dataformat)

{
  pointer pbVar1;
  HFParsingInfo *pHVar2;
  bool bVar3;
  int iVar4;
  int bit;
  ostream *poVar5;
  ulong uVar6;
  MlmWrap *pMVar7;
  string *this_00;
  pointer pbVar8;
  allocator local_281;
  HFParsingInfo *local_280;
  MlmWrap *local_278;
  pointer local_270;
  vector<int,_std::allocator<int>_> startlengths;
  string ch;
  NDevice local_220;
  string dv;
  HFParsingInfo info;
  string local_170;
  string local_150;
  string local_130;
  undefined1 local_110 [32];
  NDeviceChannel channel;
  string local_90;
  string local_70;
  string local_50;
  
  startlengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  startlengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  startlengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pMVar7 = (MlmWrap *)local_110;
  local_280 = __return_storage_ptr__;
  local_278 = this;
  std::__cxx11::string::string((string *)pMVar7,(string *)dataformat);
  bVar3 = verifyTrodesDataFormat(pMVar7,&startlengths,(string *)local_110);
  std::__cxx11::string::~string((string *)local_110);
  if (bVar3) {
    info.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    info.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    info.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    info.dataRequested.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    info.dataRequested.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    info.dataRequested.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_220.super_NetworkDataType._vptr_NetworkDataType._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&info.indices,(int *)&local_220);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)startlengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)startlengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar6 = uVar6 + 2) {
      info.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] =
           info.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1] +
           startlengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6 + 1];
    }
    pbVar1 = (channels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = (channels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    while (pbVar8 != pbVar1) {
      std::__cxx11::string::find((char *)pbVar8,0x3c55f4);
      local_270 = pbVar8;
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffff50,(ulong)pbVar8);
      CZHelp::trim_copy(&dv,(string *)&stack0xffffffffffffff50);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      pbVar8 = local_270;
      std::__cxx11::string::find((char *)local_270,0x3c55f4);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar8);
      CZHelp::trim_copy(&ch,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_70,(string *)&dv);
      findTrodesDevice(&local_220,local_278,&local_70);
      pMVar7 = (MlmWrap *)&ch;
      std::__cxx11::string::string((string *)&local_90,(string *)pMVar7);
      findTrodesChannel(&channel,pMVar7,&local_220,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      NDevice::~NDevice(&local_220);
      std::__cxx11::string::~string((string *)&local_70);
      bVar3 = NDeviceChannel::isValid(&channel);
      if (!bVar3) {
        std::__cxx11::string::string((string *)&local_150,"Could not find ",&local_281);
        error((string *)&local_220,local_278,&local_150);
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&local_220);
        poVar5 = std::operator<<(poVar5,(string *)&dv);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = std::operator<<(poVar5,(string *)&ch);
        std::operator<<(poVar5,", aborting\n");
        std::__cxx11::string::~string((string *)&local_220);
        this_00 = &local_150;
LAB_0025b11f:
        std::__cxx11::string::~string((string *)this_00);
        (local_280->dataRequested).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined8 *)&local_280->dataLength = 0;
        (local_280->dataRequested).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_280->dataRequested).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_280->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_280->sizeOf = 0;
        (local_280->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_280->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        NDeviceChannel::~NDeviceChannel(&channel);
        std::__cxx11::string::~string((string *)&ch);
        std::__cxx11::string::~string((string *)&dv);
        goto LAB_0025b15f;
      }
      iVar4 = NDeviceChannel::getType(&channel);
      if (iVar4 != 0) {
        std::__cxx11::string::string((string *)&local_170,(string *)&ch);
        error((string *)&local_220,local_278,&local_170);
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&local_220);
        std::operator<<(poVar5,
                        " is not an digital channel. Stopping and returning empty parsing info\n");
        std::__cxx11::string::~string((string *)&local_220);
        this_00 = &local_170;
        goto LAB_0025b11f;
      }
      iVar4 = NDeviceChannel::getStartByte(&channel);
      pMVar7 = (MlmWrap *)&channel;
      bit = NDeviceChannel::getStartBit((NDeviceChannel *)pMVar7);
      calculateDeviceChannelInfoIndices(pMVar7,&info.indices,&startlengths,iVar4,bit);
      NDeviceChannel::~NDeviceChannel(&channel);
      std::__cxx11::string::~string((string *)&ch);
      std::__cxx11::string::~string((string *)&dv);
      pbVar8 = local_270 + 1;
    }
    info.sizeOf = (long)info.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)info.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2 & 0xfffffffffffffffe;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&info.dataRequested,channels);
    info.dataLength =
         (int)((ulong)((long)(channels->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(channels->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 5);
    HFParsingInfo::HFParsingInfo(local_280,&info);
LAB_0025b15f:
    HFParsingInfo::~HFParsingInfo(&info);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_130,"Bad data format from Trodes, aborting\n",(allocator *)&info);
    error((string *)&local_220,local_278,&local_130);
    std::operator<<((ostream *)&std::cerr,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_130);
    (local_280->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&local_280->dataLength = 0;
    (local_280->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_280->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_280->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_280->sizeOf = 0;
    (local_280->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_280->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  pHVar2 = local_280;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&startlengths.super__Vector_base<int,_std::allocator<int>_>);
  return pHVar2;
}

Assistant:

HFParsingInfo MlmWrap::createDigitalParsingInfo(std::vector<std::string> channels, std::string dataformat){
    std::vector<int> startlengths;
    if(!verifyTrodesDataFormat(startlengths, dataformat)){
        std::cerr << error("Bad data format from Trodes, aborting\n");
        return HFParsingInfo();
    }

    HFParsingInfo info;
    //Calculate size of digital packet, first item in info.indices
    info.indices.push_back(0);
    for(size_t i = 0; i < startlengths.size(); i+=2){
        info.indices.back() += startlengths[i+1];
    }

    for(auto &channelstr : channels){
        std::string dv = CZHelp::trim_copy(channelstr.substr(0, channelstr.find(",")));
        std::string ch = CZHelp::trim_copy(channelstr.substr(channelstr.find(",")+1));

        //find channel
        NDeviceChannel channel = findTrodesChannel(findTrodesDevice(dv), ch);
        if(!channel.isValid()){
            std::cerr << error("Could not find ") << dv << ", " << ch << ", aborting\n";
            return HFParsingInfo();
        }

        //Checking for being digital
        if(channel.getType() != 0){
            std::cerr << error(ch) << " is not an digital channel. Stopping and returning empty parsing info\n";
            return HFParsingInfo();
        }

        //Push back digital indices, (startbyte, startbit)
        calculateDeviceChannelInfoIndices(info.indices, startlengths, channel.getStartByte(), channel.getStartBit());
    }
    info.sizeOf = (info.indices.size()/2)*sizeof(int16_t);
    info.dataRequested = channels;
    info.dataLength = channels.size();
    return info;
}